

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxPreIncrDecr::Emit(FxPreIncrDecr *this,VMFunctionBuilder *build)

{
  byte bVar1;
  PType *pPVar2;
  ExpEmit *this_00;
  int iVar3;
  uint opc;
  uint uVar4;
  ExpEmit EVar5;
  ExpEmit EVar6;
  ushort uVar7;
  ExpEmit value;
  ExpEmit pointer;
  uint extraout_var;
  
  if (1 < this->Token - 0x119U) {
    __assert_fail("Token == TK_Incr || Token == TK_Decr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x80d,"virtual ExpEmit FxPreIncrDecr::Emit(VMFunctionBuilder *)");
  }
  pPVar2 = (this->super_FxExpression).ValueType;
  if ((pPVar2 == this->Base->ValueType) &&
     (iVar3 = (*(pPVar2->super_PTypeBase).super_DObject._vptr_DObject[8])(), (char)iVar3 != '\0')) {
    opc = VMFunctionBuilder::GetConstantInt(build,0);
    bVar1 = ((this->super_FxExpression).ValueType)->RegType;
    EVar5._0_4_ = (*this->Base->_vptr_FxExpression[9])(this->Base,build);
    EVar5.Konst = (bool)(char)extraout_var;
    EVar5.Fixed = (bool)(char)(extraout_var >> 8);
    EVar5.Final = (bool)(char)(extraout_var >> 0x10);
    EVar5.Target = (bool)(char)(extraout_var >> 0x18);
    uVar7 = (ushort)EVar5._0_4_;
    EVar6 = EVar5;
    value = EVar5;
    pointer = EVar5;
    if ((extraout_var & 0x1000000) == 0) {
      uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers + bVar1,1);
      uVar7 = (ushort)uVar4;
      EVar6 = (ExpEmit)((ulong)((uint)bVar1 << 0x10 | uVar4 & 0xffff) | 0x1000000);
      value = EVar6;
      VMFunctionBuilder::Emit
                (build,(uint)((this->super_FxExpression).ValueType)->loadOp,uVar4 & 0xffff,
                 EVar5._0_4_ & 0xffff,opc);
    }
    if ((ulong)bVar1 == 0) {
      uVar4 = 0xff;
      if (this->Token == 0x119) {
        uVar4 = 1;
      }
      iVar3 = 0x65;
    }
    else {
      iVar3 = (uint)(this->Token != 0x119) * 2 + 0x98;
      uVar4 = VMFunctionBuilder::GetConstantFloat(build,1.0);
    }
    VMFunctionBuilder::Emit(build,iVar3,(uint)uVar7,(uint)uVar7,uVar4);
    if ((extraout_var & 0x1000000) == 0) {
      VMFunctionBuilder::Emit
                (build,(uint)((this->super_FxExpression).ValueType)->storeOp,EVar5._0_4_ & 0xffff,
                 (uint)uVar7,opc);
    }
    this_00 = &pointer;
    if (this->AddressRequested != false) {
      EVar6 = EVar5;
      this_00 = &value;
    }
    ExpEmit::Free(this_00,build);
    return EVar6;
  }
  __assert_fail("ValueType == Base->ValueType && IsNumeric()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x80e,"virtual ExpEmit FxPreIncrDecr::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxPreIncrDecr::Emit(VMFunctionBuilder *build)
{
	assert(Token == TK_Incr || Token == TK_Decr);
	assert(ValueType == Base->ValueType && IsNumeric());

	int zero = build->GetConstantInt(0);
	int regtype = ValueType->GetRegType();
	ExpEmit pointer = Base->Emit(build);
	ExpEmit value = pointer;

	if (!pointer.Target)
	{
		value = ExpEmit(build, regtype);
		build->Emit(ValueType->GetLoadOp(), value.RegNum, pointer.RegNum, zero);
	}

	if (regtype == REGT_INT)
	{
		build->Emit(OP_ADDI, value.RegNum, value.RegNum, uint8_t((Token == TK_Incr) ? 1 : -1));
	}
	else
	{
		build->Emit((Token == TK_Incr) ? OP_ADDF_RK : OP_SUBF_RK, value.RegNum, value.RegNum, build->GetConstantFloat(1.));
	}

	if (!pointer.Target)
	{
		build->Emit(ValueType->GetStoreOp(), pointer.RegNum, value.RegNum, zero);
	}

	if (AddressRequested)
	{
		value.Free(build);
		return pointer;
	}

	pointer.Free(build);
	return value;
}